

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_constants.cpp
# Opt level: O2

spv_result_t spvtools::val::ConstantPass(ValidationState_t *_,Instruction *inst)

{
  uint16_t uVar1;
  bool bVar2;
  int32_t iVar3;
  Op opcode;
  uint uVar4;
  uint uVar5;
  Instruction *pIVar6;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  Instruction *pIVar10;
  Instruction *pIVar11;
  Instruction *this;
  Instruction *pIVar12;
  spv_result_t sVar13;
  spv_result_t sVar14;
  size_t sVar15;
  ulong uVar16;
  string opcode_name;
  string local_250;
  uint local_22c;
  string local_228;
  undefined1 local_208 [5];
  char local_203;
  spv_result_t local_38;
  
  switch((inst->inst_).opcode) {
  case 0x29:
  case 0x2a:
  case 0x30:
  case 0x31:
    pIVar6 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    if ((pIVar6 != (Instruction *)0x0) && ((pIVar6->inst_).opcode == 0x14))
    goto switchD_00274965_caseD_2b;
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
    std::operator<<((ostream *)local_208,"Op");
    pcVar9 = spvOpcodeString((uint)(inst->inst_).opcode);
    std::operator<<((ostream *)local_208,pcVar9);
    std::operator<<((ostream *)local_208," Result Type <id> ");
    ValidationState_t::getIdName_abi_cxx11_(&opcode_name,_,(inst->inst_).type_id);
    std::operator<<((ostream *)local_208,(string *)&opcode_name);
    pcVar9 = " is not a boolean type.";
    break;
  default:
    goto switchD_00274965_caseD_2b;
  case 0x2c:
  case 0x33:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_208,"Op",(allocator<char> *)&local_250);
    pcVar9 = spvOpcodeString((uint)(inst->inst_).opcode);
    std::operator+(&opcode_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                   pcVar9);
    std::__cxx11::string::_M_dispose();
    pIVar6 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    if ((pIVar6 == (Instruction *)0x0) ||
       (iVar3 = spvOpcodeIsComposite((uint)(pIVar6->inst_).opcode), iVar3 == 0)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::operator<<((ostream *)local_208,(string *)&opcode_name);
      std::operator<<((ostream *)local_208," Result Type <id> ");
      ValidationState_t::getIdName_abi_cxx11_(&local_250,_,(inst->inst_).type_id);
      std::operator<<((ostream *)local_208,(string *)&local_250);
      pcVar9 = " is not a composite type.";
LAB_00274c53:
      std::operator<<((ostream *)local_208,pcVar9);
LAB_00274c65:
      sVar14 = local_38;
      std::__cxx11::string::_M_dispose();
      goto LAB_00274c6d;
    }
    lVar7 = (long)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 2;
    uVar8 = lVar7 - 3;
    uVar1 = (pIVar6->inst_).opcode;
    sVar13 = SPV_SUCCESS;
    sVar14 = SPV_SUCCESS;
    switch(uVar1) {
    case 0x17:
      uVar16 = 2;
      uVar4 = Instruction::GetOperandAs<unsigned_int>(pIVar6,2);
      if (uVar8 == uVar4) {
        uVar4 = Instruction::GetOperandAs<unsigned_int>(pIVar6,1);
        pIVar11 = ValidationState_t::FindDef(_,uVar4);
        pIVar10 = pIVar6;
        if (pIVar11 == (Instruction *)0x0) {
LAB_0027590f:
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,pIVar10);
          pcVar9 = "Component type is not defined.";
          goto LAB_0027591b;
        }
        do {
          sVar14 = sVar13;
          if ((ulong)((long)(inst->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(inst->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar16)
          goto switchD_00274aab_caseD_19;
          uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,uVar16);
          pIVar10 = ValidationState_t::FindDef(_,uVar4);
          if ((pIVar10 == (Instruction *)0x0) ||
             (bVar2 = spvOpcodeIsConstantOrUndef((uint)(pIVar10->inst_).opcode), !bVar2))
          goto LAB_00275500;
          pIVar10 = ValidationState_t::FindDef(_,(pIVar10->inst_).type_id);
        } while ((pIVar10 != (Instruction *)0x0) &&
                (uVar16 = uVar16 + 1, (pIVar11->inst_).result_id == (pIVar10->inst_).result_id));
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)local_208,(string *)&opcode_name);
        std::operator<<((ostream *)local_208," Constituent <id> ");
        ValidationState_t::getIdName_abi_cxx11_(&local_250,_,uVar4);
        std::operator<<((ostream *)local_208,(string *)&local_250);
        std::operator<<((ostream *)local_208,"s type does not match Result Type <id> ");
        ValidationState_t::getIdName_abi_cxx11_(&local_228,_,(pIVar6->inst_).result_id);
        std::operator<<((ostream *)local_208,(string *)&local_228);
        pcVar9 = "s vector element type.";
        goto LAB_002758b9;
      }
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::operator<<((ostream *)local_208,(string *)&opcode_name);
      std::operator<<((ostream *)local_208,
                      " Constituent <id> count does not match Result Type <id> ");
      ValidationState_t::getIdName_abi_cxx11_(&local_250,_,(pIVar6->inst_).result_id);
      std::operator<<((ostream *)local_208,(string *)&local_250);
      pcVar9 = "s vector component count.";
LAB_002756c0:
      std::operator<<((ostream *)local_208,pcVar9);
      sVar14 = local_38;
LAB_002756d3:
      std::__cxx11::string::_M_dispose();
      break;
    case 0x18:
      uVar4 = Instruction::GetOperandAs<unsigned_int>(pIVar6,2);
      if (uVar8 != uVar4) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)local_208,(string *)&opcode_name);
        std::operator<<((ostream *)local_208,
                        " Constituent <id> count does not match Result Type <id> ");
        ValidationState_t::getIdName_abi_cxx11_(&local_250,_,(pIVar6->inst_).result_id);
        std::operator<<((ostream *)local_208,(string *)&local_250);
        pcVar9 = "s matrix column count.";
        goto LAB_002756c0;
      }
      pIVar10 = ValidationState_t::FindDef
                          (_,(pIVar6->words_).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[2]);
      if (pIVar10 == (Instruction *)0x0) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,pIVar6);
        pcVar9 = "Column type is not defined.";
        goto LAB_0027591b;
      }
      sVar15 = 2;
      local_22c = Instruction::GetOperandAs<unsigned_int>(pIVar10,2);
      uVar4 = Instruction::GetOperandAs<unsigned_int>(pIVar10,1);
      pIVar12 = ValidationState_t::FindDef(_,uVar4);
      if (pIVar12 == (Instruction *)0x0) goto LAB_0027590f;
      do {
        sVar14 = sVar13;
        if ((ulong)((long)(inst->operands_).
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(inst->operands_).
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4) <= sVar15)
        goto switchD_00274aab_caseD_19;
        uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,sVar15);
        pIVar11 = ValidationState_t::FindDef(_,uVar4);
        if ((pIVar11 == (Instruction *)0x0) ||
           (bVar2 = spvOpcodeIsConstantOrUndef((uint)(pIVar11->inst_).opcode), !bVar2)) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::operator<<((ostream *)local_208,(string *)&opcode_name);
          std::operator<<((ostream *)local_208," Constituent <id> ");
LAB_00275a10:
          ValidationState_t::getIdName_abi_cxx11_(&local_250,_,uVar4);
          std::operator<<((ostream *)local_208,(string *)&local_250);
          pcVar9 = " is not a constant or undef.";
          goto LAB_00274c53;
        }
        this = ValidationState_t::FindDef(_,(pIVar11->inst_).type_id);
        if (this == (Instruction *)0x0) goto LAB_002759a7;
        if ((pIVar10->inst_).opcode != (this->inst_).opcode) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::operator<<((ostream *)local_208,(string *)&opcode_name);
          std::operator<<((ostream *)local_208," Constituent <id> ");
          ValidationState_t::getIdName_abi_cxx11_(&local_250,_,uVar4);
          std::operator<<((ostream *)local_208,(string *)&local_250);
          std::operator<<((ostream *)local_208," type does not match Result Type <id> ");
          ValidationState_t::getIdName_abi_cxx11_(&local_228,_,(pIVar6->inst_).result_id);
          std::operator<<((ostream *)local_208,(string *)&local_228);
          pcVar9 = "s matrix column type.";
          goto LAB_002758b9;
        }
        uVar5 = Instruction::GetOperandAs<unsigned_int>(this,1);
        pIVar11 = ValidationState_t::FindDef(_,uVar5);
        if ((pIVar12->inst_).result_id != (pIVar11->inst_).result_id) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::operator<<((ostream *)local_208,(string *)&opcode_name);
          std::operator<<((ostream *)local_208," Constituent <id> ");
          ValidationState_t::getIdName_abi_cxx11_(&local_250,_,uVar4);
          std::operator<<((ostream *)local_208,(string *)&local_250);
          std::operator<<((ostream *)local_208," component type does not match Result Type <id> ");
          ValidationState_t::getIdName_abi_cxx11_(&local_228,_,(pIVar6->inst_).result_id);
          std::operator<<((ostream *)local_208,(string *)&local_228);
          pcVar9 = "s matrix column component type.";
          goto LAB_002758b9;
        }
        sVar15 = sVar15 + 1;
      } while (local_22c ==
               (this->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start[3]);
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::operator<<((ostream *)local_208,(string *)&opcode_name);
      std::operator<<((ostream *)local_208," Constituent <id> ");
      ValidationState_t::getIdName_abi_cxx11_(&local_250,_,uVar4);
      std::operator<<((ostream *)local_208,(string *)&local_250);
      std::operator<<((ostream *)local_208,
                      " vector component count does not match Result Type <id> ");
      ValidationState_t::getIdName_abi_cxx11_(&local_228,_,(pIVar6->inst_).result_id);
      std::operator<<((ostream *)local_208,(string *)&local_228);
      pcVar9 = "s vector component count.";
      goto LAB_002758b9;
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1d:
      goto switchD_00274aab_caseD_19;
    case 0x1c:
      uVar4 = Instruction::GetOperandAs<unsigned_int>(pIVar6,1);
      pIVar10 = ValidationState_t::FindDef(_,uVar4);
      if (pIVar10 == (Instruction *)0x0) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,pIVar6);
        pcVar9 = "Element type is not defined.";
      }
      else {
        uVar16 = 2;
        uVar4 = Instruction::GetOperandAs<unsigned_int>(pIVar6,2);
        pIVar11 = ValidationState_t::FindDef(_,uVar4);
        if (pIVar11 != (Instruction *)0x0) {
          ValidationState_t::EvalInt32IfConst
                    ((tuple<bool,_bool,_unsigned_int> *)local_208,_,(pIVar11->inst_).result_id);
          if (((local_203 == '\x01') && (local_208[4] != false)) && (uVar8 != (uint)local_208._0_4_)
             ) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
            std::operator<<((ostream *)local_208,(string *)&opcode_name);
            std::operator<<((ostream *)local_208,
                            " Constituent count does not match Result Type <id> ");
            ValidationState_t::getIdName_abi_cxx11_(&local_250,_,(pIVar6->inst_).result_id);
            std::operator<<((ostream *)local_208,(string *)&local_250);
            pcVar9 = "s array length.";
            goto LAB_002756c0;
          }
          do {
            sVar14 = sVar13;
            if ((ulong)((long)(inst->operands_).
                              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(inst->operands_).
                              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar16)
            goto switchD_00274aab_caseD_19;
            uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,uVar16);
            pIVar11 = ValidationState_t::FindDef(_,uVar4);
            if ((pIVar11 == (Instruction *)0x0) ||
               (bVar2 = spvOpcodeIsConstantOrUndef((uint)(pIVar11->inst_).opcode), !bVar2)) {
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
              std::operator<<((ostream *)local_208,(string *)&opcode_name);
              std::operator<<((ostream *)local_208," Constituent <id> ");
              ValidationState_t::getIdName_abi_cxx11_(&local_250,_,uVar4);
              std::operator<<((ostream *)local_208,(string *)&local_250);
              std::operator<<((ostream *)local_208," is not a constant or undef.");
              sVar14 = local_38;
              goto LAB_002758d0;
            }
            pIVar12 = ValidationState_t::FindDef(_,(pIVar11->inst_).type_id);
            if (pIVar12 == (Instruction *)0x0) goto LAB_002759a7;
            uVar16 = uVar16 + 1;
          } while ((pIVar10->inst_).result_id == (pIVar12->inst_).result_id);
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::operator<<((ostream *)local_208,(string *)&opcode_name);
          std::operator<<((ostream *)local_208," Constituent <id> ");
          ValidationState_t::getIdName_abi_cxx11_(&local_250,_,uVar4);
          std::operator<<((ostream *)local_208,(string *)&local_250);
          std::operator<<((ostream *)local_208,"s type does not match Result Type <id> ");
          ValidationState_t::getIdName_abi_cxx11_(&local_228,_,(pIVar6->inst_).result_id);
          std::operator<<((ostream *)local_208,(string *)&local_228);
          pcVar9 = "s array element type.";
          goto LAB_002758b9;
        }
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,pIVar6);
        pcVar9 = "Length is not defined.";
      }
LAB_0027591b:
      std::operator<<((ostream *)local_208,pcVar9);
      sVar14 = local_38;
      break;
    case 0x1e:
      if ((long)(pIVar6->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(pIVar6->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start >> 2 != lVar7 + -1) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)local_208,(string *)&opcode_name);
        std::operator<<((ostream *)local_208," Constituent <id> ");
        ValidationState_t::getIdName_abi_cxx11_(&local_250,_,(inst->inst_).type_id);
        std::operator<<((ostream *)local_208,(string *)&local_250);
        std::operator<<((ostream *)local_208," count does not match Result Type <id> ");
        ValidationState_t::getIdName_abi_cxx11_(&local_228,_,(pIVar6->inst_).result_id);
        std::operator<<((ostream *)local_208,(string *)&local_228);
        std::operator<<((ostream *)local_208,"s struct member count.");
        sVar14 = local_38;
        std::__cxx11::string::_M_dispose();
        goto LAB_002756d3;
      }
      sVar15 = 1;
      do {
        uVar8 = (ulong)((int)sVar15 + 1);
        sVar14 = sVar13;
        if ((ulong)((long)(inst->operands_).
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(inst->operands_).
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar8)
        goto switchD_00274aab_caseD_19;
        uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,uVar8);
        pIVar10 = ValidationState_t::FindDef(_,uVar4);
        if ((pIVar10 == (Instruction *)0x0) ||
           (bVar2 = spvOpcodeIsConstantOrUndef((uint)(pIVar10->inst_).opcode), !bVar2)) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::operator<<((ostream *)local_208,(string *)&opcode_name);
          std::operator<<((ostream *)local_208," Constituent <id> ");
          goto LAB_00275a10;
        }
        pIVar11 = ValidationState_t::FindDef(_,(pIVar10->inst_).type_id);
        if (pIVar11 == (Instruction *)0x0) goto LAB_002757af;
        uVar5 = Instruction::GetOperandAs<unsigned_int>(pIVar6,sVar15);
        pIVar10 = ValidationState_t::FindDef(_,uVar5);
      } while ((pIVar10 != (Instruction *)0x0) &&
              (sVar15 = uVar8, (pIVar10->inst_).result_id == (pIVar11->inst_).result_id));
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::operator<<((ostream *)local_208,(string *)&opcode_name);
      std::operator<<((ostream *)local_208," Constituent <id> ");
      ValidationState_t::getIdName_abi_cxx11_(&local_250,_,uVar4);
      std::operator<<((ostream *)local_208,(string *)&local_250);
      std::operator<<((ostream *)local_208," type does not match the Result Type <id> ");
      ValidationState_t::getIdName_abi_cxx11_(&local_228,_,(pIVar6->inst_).result_id);
      std::operator<<((ostream *)local_208,(string *)&local_228);
      pcVar9 = "s member type.";
LAB_002758b9:
      std::operator<<((ostream *)local_208,pcVar9);
      sVar14 = local_38;
      std::__cxx11::string::_M_dispose();
LAB_002758d0:
      std::__cxx11::string::_M_dispose();
      break;
    default:
      if ((uVar1 == 0x1168) || (uVar1 == 0x14ee)) {
        if (uVar8 != 1) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::operator<<((ostream *)local_208,(string *)&opcode_name);
          std::operator<<((ostream *)local_208," Constituent <id> ");
          ValidationState_t::getIdName_abi_cxx11_(&local_250,_,(inst->inst_).type_id);
          std::operator<<((ostream *)local_208,(string *)&local_250);
          pcVar9 = " count must be one.";
          goto LAB_00274c53;
        }
        uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,2);
        pIVar10 = ValidationState_t::FindDef(_,uVar4);
        if ((pIVar10 == (Instruction *)0x0) ||
           (bVar2 = spvOpcodeIsConstantOrUndef((uint)(pIVar10->inst_).opcode), !bVar2)) {
LAB_00275500:
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::operator<<((ostream *)local_208,(string *)&opcode_name);
          std::operator<<((ostream *)local_208," Constituent <id> ");
          ValidationState_t::getIdName_abi_cxx11_(&local_250,_,uVar4);
          std::operator<<((ostream *)local_208,(string *)&local_250);
          std::operator<<((ostream *)local_208," is not a constant or undef.");
          goto LAB_00274c65;
        }
        pIVar11 = ValidationState_t::FindDef(_,(pIVar10->inst_).type_id);
        if (pIVar11 != (Instruction *)0x0) {
          uVar5 = Instruction::GetOperandAs<unsigned_int>(pIVar6,1);
          pIVar10 = ValidationState_t::FindDef(_,uVar5);
          if ((pIVar10 == (Instruction *)0x0) ||
             (sVar14 = sVar13, (pIVar10->inst_).result_id != (pIVar11->inst_).result_id)) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
            std::operator<<((ostream *)local_208,(string *)&opcode_name);
            std::operator<<((ostream *)local_208," Constituent <id> ");
            ValidationState_t::getIdName_abi_cxx11_(&local_250,_,uVar4);
            std::operator<<((ostream *)local_208,(string *)&local_250);
            std::operator<<((ostream *)local_208," type does not match the Result Type <id> ");
            ValidationState_t::getIdName_abi_cxx11_(&local_228,_,(pIVar6->inst_).result_id);
            std::operator<<((ostream *)local_208,(string *)&local_228);
            pcVar9 = "s component type.";
            goto LAB_002758b9;
          }
          goto switchD_00274aab_caseD_19;
        }
LAB_002757af:
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,pIVar10);
        std::operator<<((ostream *)local_208,"Result type is not defined.");
        sVar14 = local_38;
        break;
      }
      goto switchD_00274aab_caseD_19;
    }
LAB_00274c6d:
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
switchD_00274aab_caseD_19:
    std::__cxx11::string::_M_dispose();
    goto LAB_00274c7c;
  case 0x2d:
    pIVar6 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    if ((pIVar6 != (Instruction *)0x0) && ((pIVar6->inst_).opcode == 0x1a))
    goto switchD_00274965_caseD_2b;
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,pIVar6);
    std::operator<<((ostream *)local_208,"OpConstantSampler Result Type <id> ");
    ValidationState_t::getIdName_abi_cxx11_(&opcode_name,_,(inst->inst_).type_id);
    std::operator<<((ostream *)local_208,(string *)&opcode_name);
    pcVar9 = " is not a sampler type.";
    break;
  case 0x2e:
    pIVar6 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    if ((pIVar6 != (Instruction *)0x0) &&
       (bVar2 = anon_unknown_1::IsTypeNullable(&pIVar6->words_,_), bVar2))
    goto switchD_00274965_caseD_2b;
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
    std::operator<<((ostream *)local_208,"OpConstantNull Result Type <id> ");
    ValidationState_t::getIdName_abi_cxx11_(&opcode_name,_,(inst->inst_).type_id);
    std::operator<<((ostream *)local_208,(string *)&opcode_name);
    pcVar9 = " cannot have a null value.";
    break;
  case 0x32:
    uVar4 = Instruction::GetOperandAs<unsigned_int_const>(inst,0);
    pIVar6 = ValidationState_t::FindDef(_,uVar4);
    if (0xfffffffd < (pIVar6->inst_).opcode - 0x17) goto switchD_00274965_caseD_2b;
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar9 = "Specialization constant must be an integer or floating-point number.";
LAB_00274ecf:
    std::operator<<((ostream *)local_208,pcVar9);
    sVar14 = local_38;
    goto LAB_00274a0c;
  case 0x34:
    opcode = Instruction::GetOperandAs<spv::Op>(inst,2);
    uVar8 = (ulong)(opcode - OpAccessChain);
    if (opcode - OpAccessChain < 0x3f) {
      if ((0x4b90f00000000027U >> (uVar8 & 0x3f) & 1) == 0) {
        if (uVar8 == 0x30) {
          if (((_->features_).uconvert_spec_constant_op != false) ||
             (bVar2 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,Kernel), bVar2))
          goto switchD_00274965_caseD_2b;
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar9 = 
          "Prior to SPIR-V 1.4, specialization constant operation UConvert requires Kernel capability or extension SPV_AMD_gpu_shader_int16"
          ;
        }
        else {
          if (uVar8 != 0x33) goto LAB_00274ee3;
          bVar2 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,Shader);
          if (bVar2) goto switchD_00274965_caseD_2b;
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::operator<<((ostream *)local_208,"Specialization constant operation ");
          pcVar9 = spvOpcodeString(OpQuantizeToF16);
          std::operator<<((ostream *)local_208,pcVar9);
          pcVar9 = " requires Shader capability";
        }
        goto LAB_00274ecf;
      }
    }
    else {
LAB_00274ee3:
      if ((0xc < opcode - OpFAdd) || ((0x1895U >> (opcode - OpFAdd & 0x1f) & 1) == 0))
      goto switchD_00274965_caseD_2b;
    }
    bVar2 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,Kernel);
    if (bVar2) goto switchD_00274965_caseD_2b;
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
    std::operator<<((ostream *)local_208,"Specialization constant operation ");
    pcVar9 = spvOpcodeString(opcode);
    std::operator<<((ostream *)local_208,pcVar9);
    std::operator<<((ostream *)local_208," requires Kernel capability");
    sVar14 = local_38;
    goto LAB_00274a0c;
  }
  std::operator<<((ostream *)local_208,pcVar9);
  sVar14 = local_38;
  std::__cxx11::string::_M_dispose();
LAB_00274a0c:
  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
LAB_00274c7c:
  if (sVar14 != SPV_SUCCESS) {
    return sVar14;
  }
switchD_00274965_caseD_2b:
  iVar3 = spvOpcodeIsConstant((uint)(inst->inst_).opcode);
  sVar14 = SPV_SUCCESS;
  if ((((iVar3 != 0) &&
       (bVar2 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,Shader), bVar2)) &&
      (bVar2 = ValidationState_t::IsPointerType(_,(inst->inst_).type_id), sVar14 = SPV_SUCCESS,
      !bVar2)) &&
     (bVar2 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id), bVar2))
  {
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
    std::operator<<((ostream *)local_208,"Cannot form constants of 8- or 16-bit types");
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
    sVar14 = local_38;
  }
  return sVar14;
LAB_002759a7:
  ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,pIVar11);
  pcVar9 = "Result type is not defined.";
  goto LAB_0027591b;
}

Assistant:

spv_result_t ConstantPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpConstantTrue:
    case spv::Op::OpConstantFalse:
    case spv::Op::OpSpecConstantTrue:
    case spv::Op::OpSpecConstantFalse:
      if (auto error = ValidateConstantBool(_, inst)) return error;
      break;
    case spv::Op::OpConstantComposite:
    case spv::Op::OpSpecConstantComposite:
      if (auto error = ValidateConstantComposite(_, inst)) return error;
      break;
    case spv::Op::OpConstantSampler:
      if (auto error = ValidateConstantSampler(_, inst)) return error;
      break;
    case spv::Op::OpConstantNull:
      if (auto error = ValidateConstantNull(_, inst)) return error;
      break;
    case spv::Op::OpSpecConstant:
      if (auto error = ValidateSpecConstant(_, inst)) return error;
      break;
    case spv::Op::OpSpecConstantOp:
      if (auto error = ValidateSpecConstantOp(_, inst)) return error;
      break;
    default:
      break;
  }

  // Generally disallow creating 8- or 16-bit constants unless the full
  // capabilities are present.
  if (spvOpcodeIsConstant(inst->opcode()) &&
      _.HasCapability(spv::Capability::Shader) &&
      !_.IsPointerType(inst->type_id()) &&
      _.ContainsLimitedUseIntOrFloatType(inst->type_id())) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Cannot form constants of 8- or 16-bit types";
  }

  return SPV_SUCCESS;
}